

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O3

void __thiscall
OpenMD::SC::addExplicitInteraction
          (SC *this,AtomType *atype1,AtomType *atype2,RealType epsilon,RealType m,RealType n,
          RealType alpha)

{
  long lVar1;
  int iVar2;
  CubicSpline *this_00;
  CubicSpline *this_01;
  long lVar3;
  int iVar4;
  long lVar5;
  RealType r;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> rvals;
  double local_d8;
  RealType local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  double local_90;
  double local_88;
  RealType local_80;
  vector<double,_std::allocator<double>_> local_78;
  RealType local_58;
  RealType local_50;
  double local_48;
  AtomType *local_40;
  AtomType *local_38;
  
  local_d0 = alpha;
  local_80 = n;
  local_58 = m;
  local_50 = epsilon;
  addType(this,atype1);
  addType(this,atype2);
  iVar4 = this->np_;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_d8 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_78,(iterator)0x0,&local_d8);
  local_d8 = 0.0;
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_a8,
               (iterator)
               local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.0;
    local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_d8 = 0.0;
  local_40 = atype2;
  local_38 = atype1;
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_c8,
               (iterator)
               local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_d8);
  }
  else {
    *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0.0;
    local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_90 = local_d0 + local_d0;
  if (1 < this->np_) {
    local_88 = local_90 / (double)(iVar4 + -1);
    iVar4 = 1;
    do {
      local_d8 = (double)iVar4 * local_88;
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_78,
                   (iterator)
                   local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_d8);
      }
      else {
        *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_d8;
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_48 = pow(local_d0 / local_d8,local_80);
      local_48 = local_48 * local_50;
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        *local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_48;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_48 = pow(local_d0 / local_d8,local_58);
      if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_48);
      }
      else {
        *local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_48;
        local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->np_);
  }
  local_88 = pow(local_d0 / local_90,local_80);
  this_00 = (CubicSpline *)operator_new(0xa0);
  CubicSpline::CubicSpline(this_00);
  CubicSpline::addPoints(this_00,&local_78,&local_a8);
  this_01 = (CubicSpline *)operator_new(0xa0);
  CubicSpline::CubicSpline(this_01);
  CubicSpline::addPoints(this_01,&local_78,&local_c8);
  iVar4 = AtomType::getIdent(local_38);
  iVar4 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4];
  lVar5 = (long)iVar4;
  iVar2 = AtomType::getIdent(local_40);
  iVar2 = (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar2];
  lVar3 = (long)iVar2;
  lVar1 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar5].
                    super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  *(RealType *)(lVar1 + lVar3 * 0x48) = local_d0;
  *(RealType *)(lVar1 + 8 + lVar3 * 0x48) = local_50;
  *(RealType *)(lVar1 + 0x10 + lVar3 * 0x48) = local_58;
  *(RealType *)(lVar1 + 0x18 + lVar3 * 0x48) = local_80;
  *(double *)(lVar1 + 0x20 + lVar3 * 0x48) = local_90;
  *(double *)(lVar1 + 0x28 + lVar3 * 0x48) = local_88 * local_50;
  *(CubicSpline **)(lVar1 + 0x30 + lVar3 * 0x48) = this_00;
  *(CubicSpline **)(lVar1 + 0x38 + lVar3 * 0x48) = this_01;
  *(undefined1 *)(lVar1 + 0x40 + lVar3 * 0x48) = 1;
  if (iVar2 != iVar4) {
    lVar1 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar3].
                      super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    *(RealType *)(lVar1 + lVar5 * 0x48) = local_d0;
    *(RealType *)(lVar1 + 8 + lVar5 * 0x48) = local_50;
    *(RealType *)(lVar1 + 0x10 + lVar5 * 0x48) = local_58;
    *(RealType *)(lVar1 + 0x18 + lVar5 * 0x48) = local_80;
    *(double *)(lVar1 + 0x20 + lVar5 * 0x48) = local_90;
    *(double *)(lVar1 + 0x28 + lVar5 * 0x48) = local_88 * local_50;
    *(CubicSpline **)(lVar1 + 0x30 + lVar5 * 0x48) = this_00;
    *(CubicSpline **)(lVar1 + 0x38 + lVar5 * 0x48) = this_01;
    *(undefined1 *)(lVar1 + 0x40 + lVar5 * 0x48) = 1;
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SC::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType epsilon, RealType m, RealType n,
                                  RealType alpha) {
    // in case these weren't already in the map
    addType(atype1);
    addType(atype2);

    SCInteractionData mixer;

    mixer.epsilon = epsilon;
    mixer.m       = m;
    mixer.n       = n;
    mixer.alpha   = alpha;
    mixer.rCut    = 2.0 * mixer.alpha;

    RealType dr = mixer.rCut / (np_ - 1);
    vector<RealType> rvals;
    vector<RealType> vvals;
    vector<RealType> phivals;

    rvals.push_back(0.0);
    vvals.push_back(0.0);
    phivals.push_back(0.0);

    for (int k = 1; k < np_; k++) {
      RealType r = dr * k;
      rvals.push_back(r);
      vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
      phivals.push_back(pow(mixer.alpha / r, mixer.m));
    }

    mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

    CubicSpline* V = new CubicSpline();
    V->addPoints(rvals, vvals);

    CubicSpline* phi = new CubicSpline();
    phi->addPoints(rvals, phivals);

    mixer.V   = V;
    mixer.phi = phi;

    mixer.explicitlySet = true;

    int sctid1 = SCtids[atype1->getIdent()];
    int sctid2 = SCtids[atype2->getIdent()];

    MixingMap[sctid1][sctid2] = mixer;
    if (sctid2 != sctid1) { MixingMap[sctid2][sctid1] = mixer; }
    return;
  }